

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

TakeRowResult __thiscall QFormLayout::takeRow(QFormLayout *this,int row)

{
  TakeRowResult TVar1;
  uint uVar2;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  TakeRowResult result;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar3;
  char local_38 [32];
  QLayoutItem *local_18;
  QLayoutItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFormLayout *)0x4b62f4);
  uVar3 = in_ESI;
  uVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                    ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b6312);
  if (uVar3 < uVar2) {
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
              ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
              ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QList<QFormLayoutItem*>::removeOne<QFormLayoutItem*>
              ((QList<QFormLayoutItem_*> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QFormLayoutItem **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QList<QFormLayoutItem*>::removeOne<QFormLayoutItem*>
              ((QList<QFormLayoutItem_*> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QFormLayoutItem **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::removeRow
              ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    (**(code **)(*(long *)&in_RDI->context + 0x70))();
    local_18 = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = ownershipCleanedItem
                         ((QFormLayoutItem *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                          (QFormLayout *)in_RDI);
    local_10 = ownershipCleanedItem
                         ((QFormLayoutItem *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                          (QFormLayout *)in_RDI);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QMessageLogger::warning(local_38,"QFormLayout::takeRow: Invalid row %d",(ulong)in_ESI);
    memset(&local_18,0,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    TVar1.fieldItem = local_10;
    TVar1.labelItem = local_18;
    return TVar1;
  }
  __stack_chk_fail();
}

Assistant:

QFormLayout::TakeRowResult QFormLayout::takeRow(int row)
{
    Q_D(QFormLayout);

    if (Q_UNLIKELY(!(uint(row) < uint(d->m_matrix.rowCount())))) {
        qWarning("QFormLayout::takeRow: Invalid row %d", row);
        return TakeRowResult();
    }

    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);

    d->m_things.removeOne(label);
    d->m_things.removeOne(field);
    d->m_matrix.removeRow(row);

    invalidate();

    TakeRowResult result;
    result.labelItem = ownershipCleanedItem(label, this);
    result.fieldItem = ownershipCleanedItem(field, this);
    return result;
}